

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

string * __thiscall
crsGA::LogHandler::toDateTime_abi_cxx11_
          (string *__return_storage_ptr__,LogHandler *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *when)

{
  char *__s;
  time_t t;
  allocator<char> local_30 [32];
  
  t = (when->__d).__r / 1000000000;
  __s = ctime(&t);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_30);
  std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string LogHandler::toDateTime(const std::chrono::time_point<std::chrono::system_clock>& when)
{
    auto t = std::chrono::system_clock::to_time_t(when);
    auto dateTime = std::string(std::ctime(&t));
    dateTime = dateTime.substr(0, 24);
    return dateTime;
}